

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O3

UVector * icu_63::ZoneMeta::getMetazoneMappings(UnicodeString *tzid)

{
  short sVar1;
  UBool UVar2;
  UVector *pUVar3;
  UVector *pUVar4;
  char16_t *key;
  int iVar5;
  UErrorCode status;
  UChar tzidUChars [129];
  UErrorCode local_15c;
  Char16Ptr local_158;
  Char16Ptr local_150;
  char16_t *local_148;
  char16_t *local_138;
  char16_t local_128 [132];
  
  local_15c = U_ZERO_ERROR;
  local_150.p_ = local_128;
  UnicodeString::extract(tzid,&local_150,0x81,&local_15c);
  local_138 = local_150.p_;
  if (local_15c == U_STRING_NOT_TERMINATED_WARNING || U_ZERO_ERROR < local_15c) {
    return (UVector *)0x0;
  }
  if ((gOlsonToMetaInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar2 = umtx_initImplPreInit(&gOlsonToMetaInitOnce), UVar2 == '\0')) {
    if (U_ZERO_ERROR < gOlsonToMetaInitOnce.fErrCode) {
      return (UVector *)0x0;
    }
    if (U_ZERO_ERROR < local_15c) {
      return (UVector *)0x0;
    }
  }
  else {
    ucln_i18n_registerCleanup_63(UCLN_I18N_ZONEMETA,zoneMeta_cleanup);
    gOlsonToMeta = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,
                                 &local_15c);
    if (local_15c < U_ILLEGAL_ARGUMENT_ERROR) {
      uhash_setKeyDeleter_63(gOlsonToMeta,deleteUCharString);
      uhash_setValueDeleter_63(gOlsonToMeta,deleteUVector);
    }
    else {
      gOlsonToMeta = (UHashtable *)0x0;
    }
    gOlsonToMetaInitOnce.fErrCode = local_15c;
    umtx_initImplPostInit(&gOlsonToMetaInitOnce);
    if (U_ZERO_ERROR < local_15c) {
      return (UVector *)0x0;
    }
  }
  umtx_lock_63(&gZoneMetaLock);
  pUVar3 = (UVector *)uhash_get_63(gOlsonToMeta,local_128);
  umtx_unlock_63(&gZoneMetaLock);
  if (pUVar3 != (UVector *)0x0) {
    return pUVar3;
  }
  pUVar3 = createMetazoneMappings(tzid);
  if (pUVar3 == (UVector *)0x0) {
    return (UVector *)0x0;
  }
  umtx_lock_63(&gZoneMetaLock);
  pUVar4 = (UVector *)uhash_get_63(gOlsonToMeta,local_128);
  if (pUVar4 == (UVector *)0x0) {
    sVar1 = (tzid->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (tzid->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    key = (char16_t *)uprv_malloc_63((long)iVar5 * 2 + 2);
    if (key != (char16_t *)0x0) {
      local_158.p_ = key;
      UnicodeString::extract(tzid,&local_158,iVar5 + 1,&local_15c);
      local_148 = local_158.p_;
      uhash_put_63(gOlsonToMeta,key,pUVar3,&local_15c);
      pUVar4 = pUVar3;
      if (local_15c < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020f78d;
    }
    pUVar4 = (UVector *)0x0;
  }
  (*(pUVar3->super_UObject)._vptr_UObject[1])(pUVar3);
LAB_0020f78d:
  umtx_unlock_63(&gZoneMetaLock);
  return pUVar4;
}

Assistant:

const UVector* U_EXPORT2
ZoneMeta::getMetazoneMappings(const UnicodeString &tzid) {
    UErrorCode status = U_ZERO_ERROR;
    UChar tzidUChars[ZID_KEY_MAX + 1];
    tzid.extract(tzidUChars, ZID_KEY_MAX + 1, status);
    if (U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING) {
        return NULL;
    }

    umtx_initOnce(gOlsonToMetaInitOnce, &olsonToMetaInit, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    // get the mapping from cache
    const UVector *result = NULL;

    umtx_lock(&gZoneMetaLock);
    {
        result = (UVector*) uhash_get(gOlsonToMeta, tzidUChars);
    }
    umtx_unlock(&gZoneMetaLock);

    if (result != NULL) {
        return result;
    }

    // miss the cache - create new one
    UVector *tmpResult = createMetazoneMappings(tzid);
    if (tmpResult == NULL) {
        // not available
        return NULL;
    }

    // put the new one into the cache
    umtx_lock(&gZoneMetaLock);
    {
        // make sure it's already created
        result = (UVector*) uhash_get(gOlsonToMeta, tzidUChars);
        if (result == NULL) {
            // add the one just created
            int32_t tzidLen = tzid.length() + 1;
            UChar *key = (UChar*)uprv_malloc(tzidLen * sizeof(UChar));
            if (key == NULL) {
                // memory allocation error..  just return NULL
                result = NULL;
                delete tmpResult;
            } else {
                tzid.extract(key, tzidLen, status);
                uhash_put(gOlsonToMeta, key, tmpResult, &status);
                if (U_FAILURE(status)) {
                    // delete the mapping
                    result = NULL;
                    delete tmpResult;
                } else {
                    result = tmpResult;
                }
            }
        } else {
            // another thread already put the one
            delete tmpResult;
        }
    }
    umtx_unlock(&gZoneMetaLock);

    return result;
}